

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall t_c_glib_generator::close_generator(t_c_glib_generator *this)

{
  ostream *poVar1;
  int __fd;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  string program_name_uc;
  t_c_glib_generator *this_local;
  
  program_name_uc.field_2._8_8_ = this;
  std::__cxx11::string::string
            ((string *)&local_70,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  initial_caps_to_underscores(&local_50,&local_70);
  to_upper_case((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar1 = std::operator<<((ostream *)&this->f_types_,"#endif /* ");
  poVar1 = std::operator<<(poVar1,(string *)&this->nspace_uc);
  poVar1 = std::operator<<(poVar1,(string *)local_30);
  poVar1 = std::operator<<(poVar1,"_TYPES_H */");
  __fd = 0x56b600;
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_impl_,__fd);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void t_c_glib_generator::close_generator() {
  string program_name_uc = to_upper_case(initial_caps_to_underscores(program_name_));

  /* end the header inclusion guard */
  f_types_ << "#endif /* " << this->nspace_uc << program_name_uc << "_TYPES_H */" << endl;

  /* close output file */
  f_types_.close();
  f_types_impl_.close();
}